

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btGImpactBvh.cpp
# Opt level: O2

int __thiscall
btBvhTree::_calc_splitting_axis
          (btBvhTree *this,GIM_BVH_DATA_ARRAY *primitive_boxes,int startIndex,int endIndex)

{
  GIM_BVH_DATA *pGVar1;
  uint uVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  btVector3 bVar16;
  
  lVar5 = (long)startIndex;
  lVar3 = lVar5 * 0x24;
  fVar12 = 0.0;
  fVar14 = 0.0;
  fVar11 = 0.0;
  for (lVar4 = lVar5; lVar4 < endIndex; lVar4 = lVar4 + 1) {
    pGVar1 = (primitive_boxes->super_btAlignedObjectArray<GIM_BVH_DATA>).m_data;
    bVar16 = operator+((btVector3 *)((long)(pGVar1->m_bound).m_max.m_floats + lVar3),
                       (btVector3 *)((long)(pGVar1->m_bound).m_min.m_floats + lVar3));
    fVar12 = fVar12 + bVar16.m_floats[0] * 0.5;
    fVar14 = fVar14 + bVar16.m_floats[1] * 0.5;
    fVar11 = fVar11 + bVar16.m_floats[2] * 0.5;
    lVar3 = lVar3 + 0x24;
  }
  fVar6 = 1.0 / (float)(endIndex - startIndex);
  lVar4 = lVar5 * 0x24;
  fVar13 = 0.0;
  fVar15 = 0.0;
  fVar9 = 0.0;
  for (; lVar5 < endIndex; lVar5 = lVar5 + 1) {
    pGVar1 = (primitive_boxes->super_btAlignedObjectArray<GIM_BVH_DATA>).m_data;
    bVar16 = operator+((btVector3 *)((long)(pGVar1->m_bound).m_max.m_floats + lVar4),
                       (btVector3 *)((long)(pGVar1->m_bound).m_min.m_floats + lVar4));
    fVar10 = bVar16.m_floats[2] * 0.5 - fVar6 * fVar11;
    fVar7 = bVar16.m_floats[0] * 0.5 - fVar6 * fVar12;
    fVar8 = bVar16.m_floats[1] * 0.5 - fVar6 * fVar14;
    fVar13 = fVar13 + fVar7 * fVar7;
    fVar15 = fVar15 + fVar8 * fVar8;
    fVar9 = fVar9 + fVar10 * fVar10;
    lVar4 = lVar4 + 0x24;
  }
  fVar12 = 1.0 / ((float)(endIndex - startIndex) + -1.0);
  fVar13 = fVar12 * fVar13;
  fVar15 = fVar12 * fVar15;
  fVar11 = fVar15;
  if (fVar15 <= fVar13) {
    fVar11 = fVar13;
  }
  uVar2 = 2;
  if (fVar12 * fVar9 <= fVar11) {
    uVar2 = (uint)(fVar13 < fVar15);
  }
  return uVar2;
}

Assistant:

int btBvhTree::_calc_splitting_axis(
	GIM_BVH_DATA_ARRAY & primitive_boxes, int startIndex,  int endIndex)
{

	int i;

	btVector3 means(btScalar(0.),btScalar(0.),btScalar(0.));
	btVector3 variance(btScalar(0.),btScalar(0.),btScalar(0.));
	int numIndices = endIndex-startIndex;

	for (i=startIndex;i<endIndex;i++)
	{
		btVector3 center = btScalar(0.5)*(primitive_boxes[i].m_bound.m_max +
					 primitive_boxes[i].m_bound.m_min);
		means+=center;
	}
	means *= (btScalar(1.)/(btScalar)numIndices);

	for (i=startIndex;i<endIndex;i++)
	{
		btVector3 center = btScalar(0.5)*(primitive_boxes[i].m_bound.m_max +
					 primitive_boxes[i].m_bound.m_min);
		btVector3 diff2 = center-means;
		diff2 = diff2 * diff2;
		variance += diff2;
	}
	variance *= (btScalar(1.)/	((btScalar)numIndices-1)	);

	return variance.maxAxis();
}